

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::SCCAnalyzer(SCCAnalyzer *this,Options *options)

{
  Options *options_local;
  SCCAnalyzer *this_local;
  
  Options::Options(&this->options_,options);
  std::
  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
  ::map(&this->cache_);
  std::
  map<const_google::protobuf::compiler::cpp::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis,_std::less<const_google::protobuf::compiler::cpp::SCC_*>,_std::allocator<std::pair<const_google::protobuf::compiler::cpp::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  ::map(&this->analysis_cache_);
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::vector(&this->stack_);
  this->index_ = 0;
  std::
  vector<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ::vector(&this->garbage_bin_);
  return;
}

Assistant:

~SCCAnalyzer() {
    for (int i = 0; i < garbage_bin_.size(); i++) delete garbage_bin_[i];
  }